

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-rand.c
# Opt level: O0

uint32_t Rand_div(uint32_t m)

{
  uint uVar1;
  uint32_t uVar2;
  uint local_18;
  uint32_t r;
  uint32_t n;
  uint32_t m_local;
  
  if (0x10000000 < m) {
    __assert_fail("m <= 0x10000000",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-rand.c"
                  ,0xad,"uint32_t Rand_div(uint32_t)");
  }
  if (m < 2) {
    n = 0;
  }
  else if (rand_fixed) {
    n = (rand_fixval * 1000 * (m - 1)) / 100000;
  }
  else {
    uVar1 = (uint)(0x10000000 / (ulong)m);
    if (Rand_quick) {
      do {
        Rand_value = Rand_value * 0x41c64e6d + 0x3039;
        local_18 = (Rand_value >> 4) / uVar1;
      } while (m <= local_18);
    }
    else {
      do {
        uVar2 = WELLRNG1024a();
        local_18 = (uVar2 >> 4) / uVar1;
      } while (m <= local_18);
    }
    n = local_18;
  }
  return n;
}

Assistant:

uint32_t Rand_div(uint32_t m)
{
	uint32_t n, r = 0;

	/* Division by zero will result if m is larger than 0x10000000 */
	assert(m <= 0x10000000);

	/* Hack -- simple case */
	if (m <= 1) return (0);

	if (rand_fixed)
		return (rand_fixval * 1000 * (m - 1)) / (100 * 1000);

	/* Partition size */
	n = (0x10000000 / m);

	if (Rand_quick) {
		/* Use a simple RNG */
		/* Wait for it */
		while (1) {
			/* Cycle the generator */
			r = (Rand_value = LCRNG(Rand_value));

			/* Mutate a 28-bit "random" number */
			r = ((r >> 4) & 0x0FFFFFFF) / n;

			/* Done */
			if (r < m) break;
		}
	} else {
		/* Use a complex RNG */
		while (1) {
			/* Get the next pseudorandom number */
			r = WELLRNG1024a();

			/* Mutate a 28-bit "random" number */
			r = ((r >> 4) & 0x0FFFFFFF) / n;

			/* Done */
			if (r < m) break;
		}
	}

	/* Use the value */
	return (r);
}